

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

ActionResultHolder<ot::commissioner::Error> *
testing::internal::ActionResultHolder<ot::commissioner::Error>::
PerformDefaultAction<ot::commissioner::Error(unsigned_short&)>
          (FunctionMocker<ot::commissioner::Error_(unsigned_short_&)> *func_mocker,
          ArgumentTuple *args,string *call_description)

{
  ActionResultHolder<ot::commissioner::Error> *pAVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Result local_78;
  char local_38 [8];
  undefined8 uStack_30;
  
  pAVar1 = (ActionResultHolder<ot::commissioner::Error> *)operator_new(0x30);
  FunctionMocker<ot::commissioner::Error_(unsigned_short_&)>::PerformDefaultAction
            (&local_78,func_mocker,args,call_description);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.mMessage._M_dataplus._M_p == &local_78.mMessage.field_2) {
    uStack_30 = local_78.mMessage.field_2._8_8_;
    local_78.mMessage._M_dataplus._M_p = local_38;
  }
  (pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__ActionResultHolder_00395c88;
  (pAVar1->result_).value_.mCode = local_78.mCode;
  paVar2 = &(pAVar1->result_).value_.mMessage.field_2;
  (pAVar1->result_).value_.mMessage._M_dataplus._M_p = (pointer)paVar2;
  if (local_78.mMessage._M_dataplus._M_p == local_38) {
    paVar2->_M_allocated_capacity = local_78.mMessage.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&(pAVar1->result_).value_.mMessage.field_2 + 8) = uStack_30;
  }
  else {
    (pAVar1->result_).value_.mMessage._M_dataplus._M_p = local_78.mMessage._M_dataplus._M_p;
    (pAVar1->result_).value_.mMessage.field_2._M_allocated_capacity =
         local_78.mMessage.field_2._M_allocated_capacity;
  }
  (pAVar1->result_).value_.mMessage._M_string_length = local_78.mMessage._M_string_length;
  return pAVar1;
}

Assistant:

static ActionResultHolder* PerformDefaultAction(
      const FunctionMocker<F>* func_mocker,
      typename Function<F>::ArgumentTuple&& args,
      const std::string& call_description) {
    return new ActionResultHolder(Wrapper(func_mocker->PerformDefaultAction(
        std::move(args), call_description)));
  }